

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_intrabc_info(MACROBLOCKD *xd,MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,aom_writer *w)

{
  int symb;
  undefined4 *in_RSI;
  long in_RDI;
  int_mv dv_ref;
  FRAME_CONTEXT *ec_ctx;
  int use_intrabc;
  MB_MODE_INFO *mbmi;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  MV *ref;
  undefined4 in_stack_ffffffffffffffd8;
  MB_MODE_INFO *mbmi_00;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RDI + 0x1eb8);
  symb = is_intrabc_block(mbmi_00);
  ref = *(MV **)(in_RDI + 0x2998);
  aom_write_symbol((aom_writer *)mbmi_00,symb,(aom_cdf_prob *)ref,in_stack_ffffffffffffffcc);
  if (symb != 0) {
    av1_encode_dv((aom_writer *)mbmi_00,(MV *)CONCAT44(symb,in_stack_ffffffffffffffd8),ref,
                  (nmv_context *)CONCAT44(*in_RSI,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static inline void write_intrabc_info(
    MACROBLOCKD *xd, const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,
    aom_writer *w) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  int use_intrabc = is_intrabc_block(mbmi);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  aom_write_symbol(w, use_intrabc, ec_ctx->intrabc_cdf, 2);
  if (use_intrabc) {
    assert(mbmi->mode == DC_PRED);
    assert(mbmi->uv_mode == UV_DC_PRED);
    assert(mbmi->motion_mode == SIMPLE_TRANSLATION);
    int_mv dv_ref = mbmi_ext_frame->ref_mv_stack[0].this_mv;
    av1_encode_dv(w, &mbmi->mv[0].as_mv, &dv_ref.as_mv, &ec_ctx->ndvc);
  }
}